

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchFileObject
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr source;
  bool bVar1;
  int iVar2;
  cmSourceFile *file;
  string *psVar3;
  undefined4 extraout_var;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  undefined1 local_d0 [48];
  undefined1 local_a0 [48];
  string pchSource;
  string local_50;
  
  bVar1 = std::operator!=(language,"C");
  if ((((bVar1) && (bVar1 = std::operator!=(language,"CXX"), bVar1)) &&
      (bVar1 = std::operator!=(language,"OBJC"), bVar1)) &&
     (bVar1 = std::operator!=(language,"OBJCXX"), bVar1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::operator+(&pchSource,language,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &pchSource,arch);
  local_d0._8_8_ = local_a0._8_8_;
  local_d0._0_8_ = local_d0 + 0x10;
  if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
    local_d0._24_8_ = local_a0._24_8_;
  }
  else {
    local_d0._0_8_ = local_a0._0_8_;
  }
  local_a0._8_8_ = (pointer)0x0;
  local_a0[0x10] = '\0';
  local_d0._32_8_ = "";
  local_a0._0_8_ = local_a0 + 0x10;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchObjectFiles,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&pchSource);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    GetPchSource(&pchSource,this,config,language,arch);
    if (pchSource._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      file = cmMakefile::GetOrCreateSource(this->Makefile,&pchSource,false,Known);
      local_d0._8_8_ = (this->ObjectDirectory)._M_dataplus._M_p;
      local_d0._0_8_ = (this->ObjectDirectory)._M_string_length;
      psVar3 = GetObjectName_abi_cxx11_(this,file);
      local_a0._8_8_ = (psVar3->_M_dataplus)._M_p;
      local_a0._0_8_ = psVar3->_M_string_length;
      cmStrCat<>(&local_50,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_a0);
      source = pVar4.first._M_node._M_node + 2;
      std::__cxx11::string::operator=((string *)source,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      iVar2 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
      if ((char)iVar2 != '\0') {
        iVar2 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x15])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,(char *)CONCAT44(extraout_var,iVar2),
                   (allocator<char> *)local_a0);
        cmsys::SystemTools::ReplaceString((string *)source,(string *)local_d0,config);
        std::__cxx11::string::~string((string *)local_d0);
      }
    }
    std::__cxx11::string::~string((string *)&pchSource);
    if (pchSource._M_string_length == 0) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(pVar4.first._M_node._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFileObject(const std::string& config,
                                                const std::string& language,
                                                const std::string& arch)
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchObjectFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchSource = this->GetPchSource(config, language, arch);
    if (pchSource.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    auto* pchSf = this->Makefile->GetOrCreateSource(
      pchSource, false, cmSourceFileLocationKind::Known);

    filename = cmStrCat(this->ObjectDirectory, this->GetObjectName(pchSf));
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      cmSystemTools::ReplaceString(
        filename, this->GetGlobalGenerator()->GetCMakeCFGIntDir(), config);
    }
  }
  return inserted.first->second;
}